

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O0

uint64_t poplar::vbyte::decode(uint8_t *codes,uint64_t *val)

{
  uint64_t shift;
  uint64_t i;
  uint64_t *val_local;
  uint8_t *codes_local;
  
  *val = 0;
  i = 0;
  shift = 0;
  while ((codes[i] & 0x80) != 0) {
    *val = ((ulong)codes[i] & 0x7f) << ((byte)shift & 0x3f) | *val;
    shift = shift + 7;
    i = i + 1;
  }
  *val = ((ulong)codes[i] & 0x7f) << ((byte)shift & 0x3f) | *val;
  return i + 1;
}

Assistant:

inline uint64_t decode(const uint8_t* codes, uint64_t& val) {
    val = 0;
    uint64_t i = 0, shift = 0;
    while ((codes[i] & 0x80) != 0) {
        val |= (codes[i++] & 127ULL) << shift;
        shift += 7;
    }
    val |= (codes[i++] & 127ULL) << shift;
    return i;
}